

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

bool deqp::gls::pixelNearLineIntersection(int x,int y,Surface *target)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  iVar1 = target->m_width;
  pvVar2 = (target->m_pixels).m_ptr;
  iVar8 = (y + -1) * iVar1 + x;
  iVar7 = 0;
  bVar5 = true;
  iVar9 = -1;
  do {
    iVar10 = iVar7 + 1;
    if (((*(uint *)((long)pvVar2 + (long)((iVar9 + y) * iVar1 + x + -1) * 4) & 0xffffff) == 0) ||
       (iVar7 = iVar10, iVar10 < 4)) {
      lVar4 = -1;
      iVar10 = iVar7;
      do {
        lVar6 = lVar4;
        iVar7 = iVar10;
        if (lVar6 == 1) break;
        iVar7 = iVar10 + 1;
        lVar4 = lVar6 + 1;
      } while (((*(uint *)((long)pvVar2 + (long)(iVar8 + (int)lVar6 + 1) * 4) & 0xffffff) == 0) ||
              (iVar10 = iVar7, iVar7 < 4));
      bVar3 = 0 < lVar6;
    }
    else {
      bVar3 = false;
    }
    if (!bVar3) {
      return bVar5;
    }
    iVar10 = iVar9 + 1;
    bVar5 = iVar9 < 1;
    iVar8 = iVar8 + iVar1;
    iVar9 = iVar10;
    if (iVar10 == 2) {
      return bVar5;
    }
  } while( true );
}

Assistant:

static bool pixelNearLineIntersection (int x, int y, const tcu::Surface& target)
{
	// should not be called for edge pixels
	DE_ASSERT(x >= 1 && x <= target.getWidth()-2);
	DE_ASSERT(y >= 1 && y <= target.getHeight()-2);

	int coveredPixels = 0;

	for (int dy = -1; dy < 2; dy++)
	for (int dx = -1; dx < 2; dx++)
	{
		const bool targetCoverage = !isBlack(target.getPixel(x+dx, y+dy));
		if (targetCoverage)
		{
			++coveredPixels;

			// A single thin line cannot have more than 3 covered pixels in a 3x3 area
			if (coveredPixels >= 4)
				return true;
		}
	}

	return false;
}